

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SlotManager.cpp
# Opt level: O0

void __thiscall SlotManager::SlotManager(SlotManager *this,ObjectStore *objectStore)

{
  Mutex *pMVar1;
  Mutex *pMVar2;
  ulong uVar3;
  char *pcVar4;
  undefined8 *in_RDI;
  CK_SLOT_ID slotID;
  CK_SLOT_ID mask;
  CK_SLOT_ID l;
  string s;
  ByteString bs;
  ObjectStoreToken *pToken;
  size_t i;
  ByteString *in_stack_fffffffffffffee8;
  ObjectStore *in_stack_ffffffffffffff00;
  size_t in_stack_ffffffffffffff10;
  ObjectStore *in_stack_ffffffffffffff18;
  ObjectStoreToken *in_stack_ffffffffffffff48;
  CK_SLOT_ID in_stack_ffffffffffffff50;
  ObjectStore *in_stack_ffffffffffffff58;
  SlotManager *in_stack_ffffffffffffff60;
  uint local_88;
  allocator local_79;
  undefined1 local_78 [96];
  Mutex *local_18;
  
  *in_RDI = &PTR__SlotManager_00223d28;
  std::
  map<const_unsigned_long,_Slot_*const,_std::less<const_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Slot_*const>_>_>
  ::map((map<const_unsigned_long,_Slot_*const,_std::less<const_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Slot_*const>_>_>
         *)0x1ea770);
  local_18 = (Mutex *)0x0;
  while( true ) {
    pMVar1 = local_18;
    pMVar2 = (Mutex *)ObjectStore::getTokenCount(in_stack_ffffffffffffff00);
    if (pMVar2 <= pMVar1) break;
    local_78._72_8_ = ObjectStore::getToken(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    ByteString::ByteString((ByteString *)0x1ea7e6);
    (*(*(_func_int ***)local_78._72_8_)[7])(local_78._72_8_,local_78 + 0x20);
    in_stack_ffffffffffffff18 = (ObjectStore *)ByteString::const_byte_str(in_stack_fffffffffffffee8)
    ;
    in_stack_ffffffffffffff10 = ByteString::size((ByteString *)0x1ea824);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_78,(char *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
               &local_79);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    uVar3 = std::__cxx11::string::size();
    if (uVar3 < 8) {
      pcVar4 = (char *)std::__cxx11::string::c_str();
      uVar3 = strtoul(pcVar4,(char **)0x0,0x10);
      local_88 = (uint)uVar3;
    }
    else {
      in_stack_ffffffffffffff00 = (ObjectStore *)local_78;
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)&stack0xffffffffffffff58,(ulong)in_stack_ffffffffffffff00)
      ;
      pcVar4 = (char *)std::__cxx11::string::c_str();
      uVar3 = strtoul(pcVar4,(char **)0x0,0x10);
      local_88 = (uint)uVar3;
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
    }
    in_stack_ffffffffffffff50 = 0x7fffffff;
    in_stack_ffffffffffffff48 = (ObjectStoreToken *)(ulong)(local_88 & 0x7fffffff);
    insertToken(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0x7fffffff,
                in_stack_ffffffffffffff48);
    std::__cxx11::string::~string((string *)local_78);
    ByteString::~ByteString((ByteString *)0x1ea9db);
    local_18 = (Mutex *)((long)&local_18->_vptr_Mutex + 1);
  }
  ObjectStore::getTokenCount(in_stack_ffffffffffffff00);
  insertToken(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
              in_stack_ffffffffffffff48);
  return;
}

Assistant:

SlotManager::SlotManager(ObjectStore*const objectStore)
{
	// Add a slot for each token that already exists
	for (size_t i = 0; i < objectStore->getTokenCount(); i++)
	{
		ObjectStoreToken*const pToken(objectStore->getToken(i));
		ByteString bs;
		pToken->getTokenSerial(bs);
		const std::string s((const char*)bs.const_byte_str(), bs.size());

		// parse serial string that is expected to have only hex digits.
		CK_SLOT_ID l;
		if (s.size() < 8)
		{
			l = strtoul(s.c_str(), NULL, 16);
		}
		else
		{
			l = strtoul(s.substr(s.size() - 8).c_str(), NULL, 16);
		}

		// mask for 31 bits.
		// this since sunpkcs11 java wrapper is parsing the slot ID to a java int that needs to be positive.
		// java int is 32 bit and the the sign bit is removed.
		const CK_SLOT_ID mask( ((CK_SLOT_ID)1<<31)-1 );
		const CK_SLOT_ID slotID(mask&l);

		insertToken(objectStore, slotID, pToken);
	}

	// Add an empty slot
	insertToken(objectStore, objectStore->getTokenCount(), NULL);
}